

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O3

void __thiscall CppMLNN::run_train(CppMLNN *this,MatrixXd *train_examples,VectorXd *train_labels)

{
  double dVar1;
  uint uVar2;
  long lVar3;
  ostream *poVar4;
  ulong uVar5;
  pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  input_data;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  Z;
  Matrix<double,__1,__1,_0,__1,__1> labels;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  A;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  gradients;
  Matrix<double,__1,__1,_0,__1,__1> examples;
  value_type y_p;
  random_device rd;
  pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_14d8;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_14a8;
  DenseStorage<double,__1,__1,__1,_0> local_1470;
  undefined8 local_1458;
  long lStack_1450;
  undefined8 local_1448;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1438;
  DenseStorage<double,__1,__1,__1,_0> local_1420;
  vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_1408;
  DenseStorage<double,__1,__1,__1,_0> local_13e8;
  MatrixXd local_13d0;
  random_device local_13b8;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"run_train",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  preprocess_data(&local_14d8,this,train_examples,train_labels);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_1420,(DenseStorage<double,__1,__1,__1,_0> *)&local_14d8);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_1470,(DenseStorage<double,__1,__1,__1,_0> *)&local_14d8.second);
  this->m_examples =
       local_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_cols;
  this->m_input_size =
       local_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_rows;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"run_train",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":: ",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"start training...",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::random_device::random_device(&local_13b8);
  lVar3 = this->m_epoch_max;
  if (0 < lVar3) {
    do {
      if ((lVar3 <= this->m_epoch) || (this->m_loss < this->m_minimum_loss)) break;
      local_1438.
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1438.
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1438.
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (this->m_sgd_enabled == true) {
        uVar2 = std::random_device::_M_getval();
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
        .m_cols.m_value = this->m_mini_batch_size;
        uVar5 = (ulong)uVar2 %
                (ulong)(local_14d8.first.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols - local_14a8.
                                 super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                                 .
                                 super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                                 .
                                 super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                                 .m_cols.m_value);
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
        .m_data = local_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                  local_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * uVar5;
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
        .m_rows.m_value =
             local_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
        if ((local_14a8.
             super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             .m_cols.m_value |
            local_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows) < 0 &&
            local_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data != (double *)0x0) {
LAB_0011cdd7:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/MapBase.h"
                        ,0xb0,
                        "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>>, Level = 0]"
                       );
        }
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_startRow.m_value = 0;
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_outerStride =
             local_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_xpr = &local_14d8.first;
        if ((local_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols -
             local_14a8.
             super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             .m_cols.m_value < (long)uVar5) ||
           (local_14a8.
            super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
            .m_xpr = &local_14d8.first,
           (local_14a8.
            super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
            .m_cols.m_value |
           local_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows) < 0)) {
LAB_0011cdb8:
          local_14a8.
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
          .m_startRow.m_value = 0;
          local_14a8.
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
          .m_rows.m_value =
               local_14a8.
               super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
               .m_outerStride;
          local_14a8.
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
          .m_startCol.m_value = uVar5;
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Block.h"
                        ,0x93,
                        "Eigen::Block<const Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                       );
        }
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_xpr = &local_14d8.first;
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_startCol.m_value = uVar5;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&local_1420,&local_14a8,
                   (assign_op<double,_double> *)&local_1458);
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
        .m_cols.m_value = this->m_mini_batch_size;
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
        .m_data = local_14d8.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  .m_storage.m_data +
                  local_14d8.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  .m_storage.m_rows * uVar5;
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
        .m_rows.m_value =
             local_14d8.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
        if ((local_14a8.
             super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             .m_cols.m_value |
            local_14d8.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows) < 0 &&
            local_14d8.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data != (double *)0x0) goto LAB_0011cdd7;
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_xpr = &local_14d8.second;
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_startRow.m_value = 0;
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_outerStride =
             local_14d8.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
        if (((local_14a8.
              super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_cols.m_value |
             local_14d8.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows) < 0) ||
           (local_14d8.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols -
            local_14a8.
            super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
            .m_cols.m_value < (long)uVar5)) goto LAB_0011cdb8;
        local_14a8.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_startCol.m_value = uVar5;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&local_1470,&local_14a8,
                   (assign_op<double,_double> *)&local_1458);
      }
      local_14a8.
      super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
      m_data = (PointerType)0x0;
      local_14a8.
      super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
      m_rows.m_value = 0;
      local_14a8.
      super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
      m_cols.m_value = 0;
      local_1448 = 0;
      local_1458 = 0;
      lStack_1450 = 0;
      local_1408.
      super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1408.
      super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1408.
      super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      forward_propagation(this,(MatrixXd *)&local_1420,
                          (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&local_14a8,
                          (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&local_1458,&local_1408);
      std::
      vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
      ::~vector(&local_1408);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                (&local_13e8,(DenseStorage<double,__1,__1,__1,_0> *)(lStack_1450 + -0x18));
      back_propagation(&local_13d0,this,
                       (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        *)&local_14a8,
                       (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        *)&local_1458,(MatrixXd *)&local_1470,&local_1438);
      free(local_13d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      lVar3 = this->m_epoch_batch + 1;
      this->m_epoch_batch = lVar3;
      if ((lVar3 * this->m_mini_batch_size) % this->m_examples == 0) {
        this->m_epoch = this->m_epoch + 1;
        dVar1 = loss(this,(MatrixXd *)&local_13e8,(MatrixXd *)&local_1470);
        this->m_loss = dVar1;
        if (this->m_learn_rate_decay_enabled == true) {
          this->m_learn_rate =
               this->m_learn_rate_init /
               ((double)(this->m_epoch + 1) * this->m_learn_rate_decay + 1.0);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"run_train",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":: ",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"epoch: ",7);
        poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", loss: ",8);
        poVar4 = std::ostream::_M_insert<double>(this->m_loss);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"learning rate: ",0xf);
        poVar4 = std::ostream::_M_insert<double>(this->m_learn_rate);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"run_train",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":: ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"epoch: ",7);
      poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", loss: ",8);
      poVar4 = std::ostream::_M_insert<double>(this->m_loss);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      free(local_13e8.m_data);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)&local_1458);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)&local_14a8);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector(&local_1438);
      lVar3 = this->m_epoch_max;
    } while (0 < lVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"run_train",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":: ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"finish training model!",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::random_device::_M_fini();
  free(local_1470.m_data);
  free(local_1420.m_data);
  free(local_14d8.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(local_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  return;
}

Assistant:

void CppMLNN::run_train(const MatrixXd &train_examples, const VectorXd &train_labels) {
	cout << __FUNCTION__ << endl;

	auto input_data = preprocess_data(train_examples, train_labels);
	const auto& all_examples = input_data.first;
	const auto& all_labels = input_data.second;
	auto examples = all_examples;
	auto labels = all_labels;

	m_examples = all_examples.cols();
	m_input_size = all_examples.rows();

	//check_gradient(examples, labels);
    
	cout << __FUNCTION__ << ":: " << "start training..." << endl;

    // loop to minimize loss function.
	random_device rd;
    while ((m_epoch_max > 0 && m_epoch < m_epoch_max) && m_loss >= m_minimum_loss) {
		vector<MatrixXd> gradients;

		if (m_sgd_enabled) {
			// perform mini-batch.
			auto rand_sample = rd() % (all_examples.cols() - m_mini_batch_size);
			examples = all_examples.block(0, rand_sample, all_examples.rows(), m_mini_batch_size);
			labels = all_labels.block(0, rand_sample, all_labels.rows(), m_mini_batch_size);
		}

		vector<MatrixXd> Z, A;
		forward_propagation(examples, Z, A);
		auto y_p = A.back();
		back_propagation(Z, A, labels, gradients);

		m_epoch_batch++;
		if ((m_epoch_batch * m_mini_batch_size) % m_examples == 0) {
			m_epoch++;

			m_loss = loss(y_p, labels);

			if (m_learn_rate_decay_enabled) decay_learn_rate();

			cout << __FUNCTION__ << ":: " << "epoch: " << m_epoch << "/" << m_epoch_max
				<< ", loss: " << m_loss << "; ";
			cout << "learning rate: " << m_learn_rate << endl;
		}

		cout << __FUNCTION__ << ":: " << "epoch: " << m_epoch << "/" << m_epoch_max
			<< ", loss: " << m_loss << endl;
    }

    cout << endl << __FUNCTION__ << ":: " << "finish training model!" << endl;
}